

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lexer.cpp
# Opt level: O3

void __thiscall Lexer_Whitespace_Test::~Lexer_Whitespace_Test(Lexer_Whitespace_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Lexer, Whitespace) {
	MockLexer mock = mock_new(" +\n\r -(\t\t\n\r)\r\n [ \n\r]\n");
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, '+');
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, '-');
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, '(');
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, ')');
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, '[');
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, ']');
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_EOF);
	mock_free(&mock);
}